

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ReadObjectValue(BCReaderState *s)

{
  JSValue obj_00;
  JSValue v;
  JSValue v_00;
  JSValue JVar1;
  int iVar2;
  JSValue JVar3;
  JSValue obj;
  JSValue val;
  JSContext *ctx;
  BCReaderState *in_stack_000000f0;
  JSValueUnion in_stack_ffffffffffffff98;
  JSValueUnion in_stack_ffffffffffffffa0;
  JSValueUnion in_stack_ffffffffffffffa8;
  JSValueUnion JVar4;
  undefined4 local_10;
  undefined4 uStack_c;
  JSValueUnion local_8;
  
  JVar3 = JS_ReadObjectRec(in_stack_000000f0);
  JVar4 = JVar3.u;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    JVar3 = JS_ToObject((JSContext *)obj.tag,val);
    in_stack_ffffffffffffffa0 = JVar3.u;
    local_8 = (JSValueUnion)JVar3.tag;
    in_stack_ffffffffffffffa8 = local_8;
    iVar2 = JS_IsException(JVar3);
    if ((iVar2 == 0) &&
       (obj_00.tag = (int64_t)in_stack_ffffffffffffffa0.ptr,
       obj_00.u.float64 = in_stack_ffffffffffffff98.float64,
       iVar2 = BC_add_object_ref((BCReaderState *)0x16e15b,obj_00), iVar2 == 0)) {
      v.tag = (int64_t)JVar4.ptr;
      v.u.ptr = in_stack_ffffffffffffffa8.ptr;
      JS_FreeValue((JSContext *)in_stack_ffffffffffffffa0.ptr,v);
      local_10 = JVar3.u._0_4_;
      uStack_c = JVar3.u._4_4_;
      goto LAB_0016e1c5;
    }
  }
  JVar3.tag = (int64_t)JVar4.ptr;
  JVar3.u.ptr = in_stack_ffffffffffffffa8.ptr;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffffa0.ptr,JVar3);
  v_00.tag = (int64_t)JVar4.ptr;
  v_00.u.ptr = in_stack_ffffffffffffffa8.ptr;
  JS_FreeValue((JSContext *)in_stack_ffffffffffffffa0.ptr,v_00);
  local_10 = 0;
  local_8.float64 = 2.96439387504748e-323;
LAB_0016e1c5:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

static JSValue JS_ReadObjectValue(BCReaderState *s)
{
    JSContext *ctx = s->ctx;
    JSValue val, obj = JS_UNDEFINED;

    val = JS_ReadObjectRec(s);
    if (JS_IsException(val))
        goto fail;
    obj = JS_ToObject(ctx, val);
    if (JS_IsException(obj))
        goto fail;
    if (BC_add_object_ref(s, obj))
        goto fail;
    JS_FreeValue(ctx, val);
    return obj;
 fail:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}